

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  WavParser *this;
  TestFileType in_EDX;
  string Path;
  string local_30;
  
  WavParserHelper::GetTestFilePath_abi_cxx11_(&local_30,(WavParserHelper *)0x4,in_EDX);
  this = (WavParser *)operator_new(0x34);
  WavParser::WavParser(this);
  iVar1 = (*this->_vptr_WavParser[2])(this,&local_30);
  if ((char)iVar1 != '\0') {
    (*this->_vptr_WavParser[3])(this);
  }
  std::istream::get();
  (*this->_vptr_WavParser[1])(this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main()
{
	std::string Path = WavParserHelper::GetTestFilePath(TestFileType::Int16Stereo);

	auto MyParser = new WavParser();

	if (MyParser->LoadFile(Path))
	{
		MyParser->Parse();
	}

	std::cin.get();

	delete MyParser;
	return 0;
}